

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rendering_input_attachment_index_info
          (Impl *this,Value *state,VkRenderingInputAttachmentIndexInfoKHR **out_info)

{
  bool bVar1;
  uint uVar2;
  VkRenderingInputAttachmentIndexInfo *pVVar3;
  Type pGVar4;
  uint *puVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint32_t i;
  ulong uVar6;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkRenderingInputAttachmentIndexInfo>(&this->allocator)
  ;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"colorAttachmentCount");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->colorAttachmentCount = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"colorAttachmentInputIndices");
  if (bVar1) {
    puVar5 = ScratchAllocator::allocate_n<unsigned_int>
                       (&this->allocator,(ulong)pVVar3->colorAttachmentCount);
    for (uVar6 = 0; uVar6 < pVVar3->colorAttachmentCount; uVar6 = uVar6 + 1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"colorAttachmentInputIndices");
      this_00 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::operator[](pGVar4,(SizeType)uVar6);
      uVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(this_00);
      puVar5[uVar6] = uVar2;
    }
    pVVar3->pColorAttachmentInputIndices = puVar5;
  }
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"depthInputAttachmentIndex");
  if (bVar1) {
    puVar5 = ScratchAllocator::allocate<unsigned_int>(&this->allocator);
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"depthInputAttachmentIndex");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar4);
    *puVar5 = uVar2;
    pVVar3->pDepthInputAttachmentIndex = puVar5;
  }
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"stencilInputAttachmentIndex");
  if (bVar1) {
    puVar5 = ScratchAllocator::allocate<unsigned_int>(&this->allocator);
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"stencilInputAttachmentIndex");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar4);
    *puVar5 = uVar2;
    pVVar3->pStencilInputAttachmentIndex = puVar5;
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rendering_input_attachment_index_info(const Value &state, VkRenderingInputAttachmentIndexInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderingInputAttachmentIndexInfoKHR>();
	info->colorAttachmentCount = state["colorAttachmentCount"].GetUint();
	if (state.HasMember("colorAttachmentInputIndices"))
	{
		auto *locs = allocator.allocate_n<uint32_t>(info->colorAttachmentCount);
		for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			locs[i] = state["colorAttachmentInputIndices"][i].GetUint();
		info->pColorAttachmentInputIndices = locs;
	}

	if (state.HasMember("depthInputAttachmentIndex"))
	{
		auto *loc = allocator.allocate<uint32_t>();
		*loc = state["depthInputAttachmentIndex"].GetUint();
		info->pDepthInputAttachmentIndex = loc;
	}

	if (state.HasMember("stencilInputAttachmentIndex"))
	{
		auto *loc = allocator.allocate<uint32_t>();
		*loc = state["stencilInputAttachmentIndex"].GetUint();
		info->pStencilInputAttachmentIndex = loc;
	}

	*out_info = info;
	return true;
}